

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hpp
# Opt level: O0

CaseResult * __thiscall
rc::detail::CaseResultHelper<void>::resultOf<void(*)()>
          (CaseResult *__return_storage_ptr__,CaseResultHelper<void> *this,_func_void **callable)

{
  allocator<char> local_39;
  string local_38;
  CaseResultHelper<void> *local_18;
  _func_void **callable_local;
  
  local_18 = this;
  callable_local = (_func_void **)__return_storage_ptr__;
  (**(code **)this)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"no exceptions thrown",&local_39);
  CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

static CaseResult resultOf(const Callable &callable, Args &&... args) {
    callable(std::forward<Args>(args)...);
    return CaseResult(CaseResult::Type::Success, "no exceptions thrown");
  }